

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O0

void __thiscall
CryptoUtil_EncodeBase64DataEmpty_Test::TestBody(CryptoUtil_EncodeBase64DataEmpty_Test *this)

{
  ByteData *this_00;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  CryptoUtil local_48 [8];
  string result;
  ByteData data;
  CryptoUtil_EncodeBase64DataEmpty_Test *this_local;
  
  this_00 = (ByteData *)((long)&result.field_2 + 8);
  cfd::core::ByteData::ByteData(this_00);
  cfd::core::CryptoUtil::EncodeBase64_abi_cxx11_(local_48,this_00);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ((internal *)local_68,"result.c_str()","\"\"",pcVar2,"");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_cryptoutil.cpp"
               ,0x23e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  std::__cxx11::string::~string((string *)local_48);
  cfd::core::ByteData::~ByteData((ByteData *)((long)&result.field_2 + 8));
  return;
}

Assistant:

TEST(CryptoUtil, EncodeBase64DataEmpty) {
  ByteData data;
  std::string result = CryptoUtil::EncodeBase64(data);
  EXPECT_STREQ(result.c_str(), "");
}